

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<void_*>::data(QList<void_*> *this)

{
  QArrayDataPointer<void_*> *this_00;
  void **ppvVar1;
  QArrayDataPointer<void_*> *in_RDI;
  
  detach((QList<void_*> *)0x10ca6c);
  this_00 = (QArrayDataPointer<void_*> *)QArrayDataPointer<void_*>::operator->(in_RDI);
  ppvVar1 = QArrayDataPointer<void_*>::data(this_00);
  return ppvVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }